

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::ReferenceRenderer::render
          (ReferenceRenderer *this,Surface *target,Frame *frame)

{
  ushort uVar1;
  int x;
  int y;
  void *pvVar2;
  long lVar3;
  size_t drawNdx;
  ulong uVar4;
  UVec4 local_90;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  lVar3 = 0x16;
  for (uVar4 = 0; pvVar2 = (target->m_pixels).m_ptr,
      uVar4 < (ulong)((long)((target->m_pixels).m_cap - (long)pvVar2) / 0x18); uVar4 = uVar4 + 1) {
    if (*(uint *)((long)pvVar2 + lVar3 + -0x16) < 2) {
      uVar1 = *(ushort *)((long)pvVar2 + lVar3 + -2);
      local_90.m_data._0_8_ = ZEXT58(CONCAT14((char)(uVar1 >> 8),(uint)(uVar1 & 0xff)));
      local_90.m_data[2] = (uint)*(byte *)((long)pvVar2 + lVar3);
      local_90.m_data[3] = 0xff;
      tcu::Surface::getAccess(&local_80,(Surface *)this);
      x = *(int *)((long)pvVar2 + lVar3 + -0x12);
      y = *(int *)((long)pvVar2 + lVar3 + -0xe);
      tcu::getSubregion(&local_58,&local_80,x,y,*(int *)((long)pvVar2 + lVar3 + -10) - x,
                        *(int *)((long)pvVar2 + lVar3 + -6) - y);
      tcu::clear(&local_58,&local_90);
    }
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void ReferenceRenderer::render (tcu::Surface* target, const Frame& frame) const
{
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& coloredRect = frame.draws[drawNdx].rect;
		if (frame.draws[drawNdx].drawType == PartialUpdateTest::DRAWTYPE_GLES2_RENDER || frame.draws[drawNdx].drawType == PartialUpdateTest::DRAWTYPE_GLES2_CLEAR)
		{
			const tcu::UVec4 color(coloredRect.color.x(), coloredRect.color.y(), coloredRect.color.z(), 255);
			tcu::clear(tcu::getSubregion(target->getAccess(), coloredRect.bottomLeft.x(), coloredRect.bottomLeft.y(),
										 coloredRect.topRight.x()-coloredRect.bottomLeft.x(), coloredRect.topRight.y()-coloredRect.bottomLeft.y()), color);
		}
		else
			DE_FATAL("Invalid drawtype");
	}
}